

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O1

void av1_setup_frame_size(AV1_COMP *cpi)

{
  RESIZE_MODE RVar1;
  SUPERRES_AUTO_SEARCH_TYPE SVar2;
  aom_enc_pass aVar3;
  aom_superres_mode aVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  byte bVar10;
  int extraout_EDX;
  int iVar11;
  int encode_width;
  int bottom_index;
  int top_index;
  int local_48;
  int iStack_44;
  byte local_40;
  int local_38;
  int local_34;
  
  (cpi->common).superres_scale_denominator = '\b';
  local_48 = (cpi->oxcf).frm_dim_cfg.width;
  iStack_44 = (cpi->oxcf).frm_dim_cfg.height;
  local_40 = 8;
  aVar3 = (cpi->oxcf).pass;
  if (aVar3 == AOM_RC_FIRST_PASS) goto LAB_0022bef9;
  if ((((aVar3 == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) && (cpi->ppi->use_svc != 0)) &&
     ((iVar11 = (cpi->common).width, iVar11 != local_48 || ((cpi->common).height != iStack_44)))) {
    local_48 = iVar11;
    iStack_44 = (cpi->common).height;
    goto LAB_0022bef9;
  }
  if (cpi->compressor_stage == '\x01') goto LAB_0022bef9;
  iVar11 = (cpi->resize_pending_params).width;
  if ((iVar11 == 0) || (iVar7 = (cpi->resize_pending_params).height, iVar7 == 0)) {
    bVar10 = 8;
    if (((cpi->common).seq_params)->reduced_still_picture_hdr == '\0') {
      RVar1 = (cpi->oxcf).resize_cfg.resize_mode;
      if (RVar1 == '\x02') {
        calculate_next_resize_scale_seed = calculate_next_resize_scale_seed * 0x41c64e6d + 0x3039;
        bVar10 = (char)(calculate_next_resize_scale_seed >> 0x10) +
                 (char)((calculate_next_resize_scale_seed >> 0x10 & 0x7fff) / 9) * -9 + 8;
      }
      else if (RVar1 == '\x01') {
        if ((cpi->common).current_frame.frame_type == '\0') {
          bVar10 = (cpi->oxcf).resize_cfg.resize_kf_scale_denominator;
        }
        else {
          bVar10 = (cpi->oxcf).resize_cfg.resize_scale_denominator;
        }
      }
    }
    av1_calculate_scaled_size(&local_48,&iStack_44,(uint)bVar10);
  }
  else {
    (cpi->resize_pending_params).width = 0;
    (cpi->resize_pending_params).height = 0;
    local_48 = iVar11;
    iStack_44 = iVar7;
    if ((cpi->oxcf).superres_cfg.superres_mode == AOM_SUPERRES_NONE) goto LAB_0022bef9;
  }
  bVar10 = 8;
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    switch(cpi->superres_mode) {
    case AOM_SUPERRES_FIXED:
switchD_0022bfa0_caseD_1:
      if ((cpi->common).current_frame.frame_type == '\0') {
        bVar10 = (cpi->oxcf).superres_cfg.superres_kf_scale_denominator;
      }
      else {
        bVar10 = (cpi->oxcf).superres_cfg.superres_scale_denominator;
      }
      break;
    case AOM_SUPERRES_RANDOM:
      calculate_next_superres_scale_seed = calculate_next_superres_scale_seed * 0x41c64e6d + 0x3039;
      bVar10 = (char)(calculate_next_superres_scale_seed >> 0x10) +
               (char)((calculate_next_superres_scale_seed >> 0x10 & 0x7fff) / 9) * -9 + 8;
      break;
    case AOM_SUPERRES_QTHRESH:
      if ((cpi->common).features.allow_screen_content_tools == false) {
        if (((cpi->oxcf).rc_cfg.mode & ~AOM_CQ) == AOM_VBR) {
          av1_set_target_rate(cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height);
        }
        iVar7 = av1_rc_pick_q_and_bounds
                          (cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                           (uint)cpi->gf_frame_index,&local_38,&local_34);
        uVar8 = (ulong)(((cpi->common).current_frame.frame_type & 0xfd) == 0);
        bVar10 = 8;
        iVar11 = extraout_EDX;
        if ((cpi->oxcf).tile_cfg.tile_widths[uVar8 - 0x1d] < iVar7) {
LAB_0022c1d4:
          bVar10 = get_superres_denom_for_qindex(cpi,iVar7,iVar11,(int)uVar8);
        }
      }
      break;
    case AOM_SUPERRES_AUTO:
      if ((cpi->common).features.allow_screen_content_tools == false) {
        if (((cpi->oxcf).rc_cfg.mode & ~AOM_CQ) == AOM_VBR) {
          av1_set_target_rate(cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height);
        }
        uVar9 = 0;
        iVar7 = av1_rc_pick_q_and_bounds
                          (cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                           (uint)cpi->gf_frame_index,&local_38,&local_34);
        SVar2 = (cpi->sf).hl_sf.superres_auto_search_type;
        uVar8 = CONCAT71((int7)((ulong)uVar9 >> 8),SVar2);
        iVar11 = (uint)(SVar2 == '\x02') * 0x80;
        bVar10 = 8;
        if (iVar7 != iVar11 &&
            SBORROW4(iVar7,iVar11) == (int)(iVar7 + (uint)(SVar2 == '\x02') * -0x80) < 0) {
          if (SVar2 != '\0') goto LAB_0022c1d4;
          goto switchD_0022bfa0_caseD_1;
        }
      }
    }
  }
  iVar11 = (cpi->oxcf).frm_dim_cfg.width;
  local_40 = bVar10;
  if (local_48 * 8 < (int)((uint)bVar10 * iVar11) / 2) {
    RVar1 = (cpi->oxcf).resize_cfg.resize_mode;
    aVar4 = cpi->superres_mode;
    iVar7 = (cpi->oxcf).frm_dim_cfg.height;
    uVar8 = (long)((local_48 >> 1) + iVar11 * 8) / (long)local_48;
    uVar5 = (long)((iStack_44 >> 1) + iVar7 * 8) / (long)iStack_44;
    if ((int)uVar5 < (int)uVar8) {
      uVar5 = uVar8;
    }
    uVar8 = uVar5 & 0xffffffff;
    if (aVar4 == AOM_SUPERRES_RANDOM && RVar1 != '\x02') {
      lVar6 = 0x80 / (long)(int)uVar5;
      local_40 = (byte)lVar6;
      if ((8 < local_40) && (local_48 * 8 < (int)(((uint)lVar6 & 0xff) * iVar11) / 2)) {
        local_40 = local_40 - 1;
      }
    }
    else if (aVar4 == AOM_SUPERRES_RANDOM || RVar1 != '\x02') {
      if (aVar4 == AOM_SUPERRES_RANDOM && RVar1 == '\x02') {
        do {
          if ((int)(uint)local_40 < (int)uVar8) {
            uVar8 = (ulong)((int)uVar8 - 1);
          }
          else {
            local_40 = local_40 - 1;
          }
          local_48 = iVar11;
          iStack_44 = iVar7;
          av1_calculate_scaled_size(&local_48,&iStack_44,(int)uVar8);
        } while ((local_48 * 8 < (int)(iVar11 * (uint)local_40) / 2) &&
                (8 < local_40 || 8 < (int)uVar8));
      }
    }
    else {
      local_48 = iVar11;
      iStack_44 = iVar7;
      av1_calculate_scaled_size(&local_48,&iStack_44,(uint)(0x80 / bVar10));
      if ((bVar10 < 0xf) && (local_48 * 8 < (int)((uint)local_40 * iVar11) / 2)) {
        local_48 = iVar11;
        iStack_44 = iVar7;
        av1_calculate_scaled_size(&local_48,&iStack_44,0x80 / bVar10 - 1);
      }
    }
  }
LAB_0022bef9:
  local_38 = iStack_44;
  (cpi->common).superres_upscaled_width = local_48;
  (cpi->common).superres_upscaled_height = iStack_44;
  (cpi->common).superres_scale_denominator = local_40;
  av1_calculate_scaled_superres_size(&local_48,&local_38,(uint)local_40);
  av1_set_frame_size(cpi,local_48,local_38);
  return;
}

Assistant:

void av1_setup_frame_size(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  // Reset superres params from previous frame.
  cm->superres_scale_denominator = SCALE_NUMERATOR;
  const size_params_type rsz = calculate_next_size_params(cpi);
  setup_frame_size_from_params(cpi, &rsz);

  assert(av1_is_min_tile_width_satisfied(cm));
}